

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O2

void __thiscall FileManager::FileManager(FileManager *this)

{
  anon_union_4_2_94730047 u;
  
  (this->files).
  super__Vector_base<std::shared_ptr<AssemblerFile>,_std::allocator<std::shared_ptr<AssemblerFile>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->files).
  super__Vector_base<std::shared_ptr<AssemblerFile>,_std::allocator<std::shared_ptr<AssemblerFile>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->files).
  super__Vector_base<std::shared_ptr<AssemblerFile>,_std::allocator<std::shared_ptr<AssemblerFile>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->ownEndianness = Little;
  reset(this);
  return;
}

Assistant:

FileManager::FileManager()
{
	// detect own endianness
	volatile union
	{
		uint32_t i;
		uint8_t c[4];
	} u;
	u.c[3] = 0xAA;
	u.c[2] = 0xBB;
	u.c[1] = 0xCC;
	u.c[0] = 0xDD;

	if (u.i == 0xDDCCBBAA)
		ownEndianness = Endianness::Big;
	else if (u.i == 0xAABBCCDD)
		ownEndianness = Endianness::Little;
	else
		Logger::printError(Logger::Error, "Running on unknown endianness");

	reset();
}